

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O3

void * __thiscall ImportedFuncWrapper::getValuePtr(ImportedFuncWrapper *this,FieldID fId)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExeNodeWrapper *pEVar4;
  long lVar5;
  bool bVar6;
  bool isOk;
  char local_29;
  
  pEVar4 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
  if (pEVar4 != (ExeNodeWrapper *)0x0) {
    pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      bVar6 = false;
    }
    else {
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])(pEVar1);
      bVar6 = iVar2 == 0x40;
      pEVar4 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               parentNode;
    }
    iVar2 = (*(pEVar4->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer
              [0x1c])(pEVar4,(long)fId,0xffffffffffffffff,&local_29);
    if (local_29 == '\x01') {
      lVar5 = (long)iVar2;
      if (bVar6) {
        lVar5 = CONCAT44(extraout_var,iVar2);
      }
      if (1 < lVar5 + 1U) {
        iVar2 = (*(((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                    super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer).
                  _vptr_AbstractByteBuffer[0xb])();
        pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                          (pEVar1,((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                   super_ExeNodeWrapper.entryNum << (iVar2 == 0x40 | 2U)) + lVar5,2,
                           0);
        pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                          (pEVar1,CONCAT44(extraout_var_00,iVar3),(ulong)(iVar2 == 0x40) * 4 + 4,0);
        return (void *)CONCAT44(extraout_var_01,iVar2);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* ImportedFuncWrapper::getValuePtr(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return NULL;
    bool is64 = isBit64();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) {
        //printf("Failed getting value!\n");
        return NULL;
    }
    if (!is64) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 || thunkRva == -1) return NULL;

    bufsize_t thunkValSize = this->getThunkValSize();
    offset_t offset = static_cast<offset_t>(this->entryNum) * thunkValSize;

    offset_t thunkAddr = m_Exe->toRaw(thunkRva + offset, Executable::RVA);
    void* thunkPtr = m_Exe->getContentAt(thunkAddr, thunkValSize);
    return thunkPtr;
}